

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void CVmObjBigNum::compute_exp_into(char *dst,char *src)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  char *ext2_00;
  undefined8 *puVar5;
  long *plVar6;
  size_t sVar7;
  long lVar8;
  int dig;
  int twos;
  size_t decpt_idx;
  size_t idx;
  long new_exp;
  int use_int_fact;
  ulong n_fact;
  ulong n;
  char *tmp;
  err_frame_t err_cur__;
  char *ln10;
  size_t prec;
  char *ext6;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  undefined1 *puVar9;
  uint *ext2_01;
  char *src_00;
  uint *ext;
  undefined1 *val;
  unsigned_long *remp;
  unsigned_long in_stack_fffffffffffffde8;
  void *pvVar10;
  char *in_stack_fffffffffffffdf0;
  undefined8 uVar11;
  char *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe10;
  char *ext2_02;
  char *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *new_ext;
  uint local_1c4;
  ulong local_1b8;
  int local_1ac;
  ulong local_1a0;
  long local_198;
  ulong local_188;
  long local_180;
  uint local_170 [2];
  undefined8 local_168;
  void *in_stack_fffffffffffffea0;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff80;
  char *pcVar12;
  char *in_stack_ffffffffffffff88;
  char *pcVar13;
  char *in_stack_ffffffffffffff90;
  char *new_ext_00;
  undefined1 local_68 [8];
  char *local_60;
  char *local_58;
  undefined4 local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c [5];
  
  ext2_00 = (char *)get_prec((char *)0x2b6fcd);
  cache_ln10(in_stack_ffffffffffffff10);
  puVar9 = local_68;
  ext2_01 = &local_44;
  src_00 = &stack0xffffffffffffff90;
  ext = &local_48;
  val = &stack0xffffffffffffff80;
  remp = (unsigned_long *)&local_50;
  alloc_temp_regs((size_t)(ext2_00 + 3),6,&local_58,local_3c,&local_60,&local_40);
  puVar5 = (undefined8 *)_ZTW11G_err_frame();
  local_168 = *puVar5;
  plVar6 = (long *)_ZTW11G_err_frame();
  *plVar6 = (long)local_170;
  local_170[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffea8);
  iVar3 = (int)((ulong)puVar9 >> 0x20);
  if (local_170[0] == 0) {
    compute_quotient_into
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,ext2_00
              );
    iVar3 = get_exp((char *)0x2b70fc);
    if (iVar3 < 0) {
      local_1b8 = 0;
    }
    else {
      iVar3 = get_exp((char *)0x2b710e);
      local_1b8 = (ulong)iVar3;
    }
    local_198 = 0;
    for (local_1a0 = 0; local_1a0 < local_1b8; local_1a0 = local_1a0 + 1) {
      sVar7 = get_prec((char *)0x2b7181);
      if (local_1a0 < sVar7) {
        local_1c4 = get_dig(local_58,local_1a0);
      }
      else {
        local_1c4 = 0;
      }
      local_198 = (long)(int)local_1c4 + local_198 * 10;
      iVar3 = get_neg(local_58);
      lVar8 = 0x7ffe;
      if (iVar3 != 0) {
        lVar8 = 0x8001;
      }
      if (lVar8 < local_198) {
        err_throw(0);
      }
      sVar7 = get_prec((char *)0x2b7255);
      if (local_1a0 < sVar7) {
        set_dig(local_58,local_1a0,0);
      }
    }
    get_neg(local_58);
    normalize((char *)ext);
    compute_prod_into(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10)
    ;
    new_ext = local_58;
    get_one();
    copy_val((char *)ext,src_00,(int)((ulong)ext2_01 >> 0x20));
    div_by_long(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,remp);
    local_1ac = 0;
    while (iVar3 = compare_abs(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0), 0 < iVar3) {
      div_by_long(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,remp);
      local_1ac = local_1ac + 1;
    }
    ext2_02 = local_60;
    get_one();
    copy_val((char *)ext,src_00,(int)((ulong)ext2_01 >> 0x20));
    compute_sum_into((char *)ext,src_00,(char *)ext2_01);
    compute_prod_into(new_ext,in_stack_fffffffffffffe18,ext2_02);
    new_ext_00 = in_stack_ffffffffffffff90;
    get_one();
    copy_val((char *)ext,src_00,(int)((ulong)ext2_01 >> 0x20));
    mul_by_long((char *)remp,(unsigned_long)val);
    local_180 = 2;
    local_188 = 2;
    bVar2 = true;
    while( true ) {
      if (bVar2) {
        copy_val((char *)ext,src_00,(int)((ulong)ext2_01 >> 0x20));
        div_by_long(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,remp);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_180 + 1;
        pcVar12 = in_stack_ffffffffffffff80;
        pcVar13 = in_stack_ffffffffffffff88;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xccccccccccccccc)) / auVar1,0) < local_188) {
          bVar2 = false;
        }
        else {
          local_188 = (local_180 + 1) * local_188;
        }
      }
      else {
        compute_quotient_into
                  (new_ext_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,ext2_00);
        pcVar12 = in_stack_ffffffffffffff80;
        pcVar13 = in_stack_ffffffffffffff88;
      }
      iVar3 = is_zero(pcVar13);
      if (iVar3 != 0) break;
      iVar3 = get_exp((char *)0x2b74fa);
      iVar4 = get_exp((char *)0x2b750b);
      sVar7 = get_prec((char *)0x2b7524);
      if ((int)sVar7 < iVar3 - iVar4) break;
      compute_sum_into((char *)ext,src_00,(char *)ext2_01);
      local_180 = local_180 + 1;
      in_stack_ffffffffffffff80 = local_58;
      local_58 = pcVar12;
      mul_by_long((char *)remp,(unsigned_long)val);
      compute_prod_into(new_ext,in_stack_ffffffffffffff90,ext2_02);
      in_stack_ffffffffffffff88 = local_60;
      local_60 = pcVar13;
    }
    for (; iVar3 = (int)((ulong)puVar9 >> 0x20), local_1ac != 0; local_1ac = local_1ac + -1) {
      compute_prod_into(new_ext,in_stack_ffffffffffffff90,ext2_02);
    }
    get_one();
    copy_val((char *)ext,src_00,(int)((ulong)ext2_01 >> 0x20));
    set_exp((char *)ext2_01,iVar3);
    iVar4 = (int)((ulong)ext2_01 >> 0x20);
    compute_prod_into(new_ext,in_stack_ffffffffffffff90,ext2_02);
    copy_val((char *)ext,src_00,iVar4);
  }
  if ((local_170[0] & 0x8000) == 0) {
    local_170[0] = local_170[0] | 0x8000;
    release_temp_regs(6,(ulong)local_3c[0],(ulong)local_40,(ulong)local_44,(ulong)local_48,
                      (ulong)local_4c,CONCAT44(iVar3,local_50));
  }
  uVar11 = local_168;
  puVar5 = (undefined8 *)_ZTW11G_err_frame();
  *puVar5 = uVar11;
  if ((local_170[0] & 0x4001) != 0) {
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    pvVar10 = in_stack_fffffffffffffea0;
    if ((*(uint *)*puVar5 & 2) != 0) {
      plVar6 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar6 + 0x10));
      pvVar10 = in_stack_fffffffffffffea0;
    }
    in_stack_fffffffffffffea0 = pvVar10;
    plVar6 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar6 + 0x10) = pvVar10;
    err_rethrow();
  }
  if ((local_170[0] & 2) != 0) {
    free(in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_exp_into(char *dst, const char *src)
{
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6;
    size_t prec = get_prec(dst);
    const char *ln10;

    /* get the constant value of ln10 to the required precision */
    ln10 = cache_ln10(prec + 3);

    /* allocate temporary registers */
    alloc_temp_regs(prec + 3, 6,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        char *tmp;
        ulong n;
        ulong n_fact;
        int use_int_fact;
        long new_exp;
        size_t idx;
        size_t decpt_idx;
        int twos;

        /*
         *   We want to calculate e^x.  Observe that a^x = e^(x*ln(x)), so
         *   10^x = e^(x*ln(10)).  We can rewrite our desired expression
         *   e^x as 
         *   
         *   e^[(x/ln(10)) * ln(10)]
         *   
         *   which is thus
         *   
         *   10^(x / ln(10))
         *   
         *   We store our numbers as a mantissa times 10 raised to an
         *   integer exponent.  Clearly the exponent of 10 in the formula
         *   above is not always an integer (in fact, it's extremely rare
         *   that it would be an integer), so we still have more work to
         *   do.  What we must do is obtain an integer exponent.  So, let
         *   us define y = x/ln(10); we can now rewrite the above as
         *   
         *   10^(int(y) + frac(y))
         *   
         *   where int(y) is the integer portion of y and frac(y) is the
         *   fractional portion (y - int(y)).  We can rewrite the above as
         *   
         *   10^frac(y) * 10^int(y)
         *   
         *   which we can further rewrite as
         *   
         *   e^(frac(y)*ln(10)) * 10^int(y)
         *   
         *   We haven't made the problem of finding an exponential
         *   disappear, but we've reduced the argument to a very
         *   manageable range, which is important because it makes the
         *   Taylor series converge quickly.  Furthermore, it's extremely
         *   inexpensive to separate out the problem like this, since it
         *   falls quite naturally out of the representation we use, so it
         *   doesn't add much overhead to do this preparation work.  
         */

        /* first, calculate x/ln(10) into r1 */
        compute_quotient_into(ext1, 0, src, ln10);

        /* 
         *   compute the integer portion of x/ln(10) - it has to fit in a
         *   16-bit integer, (-32768 to +32767), because this is going to
         *   be the exponent of the result (or roughly so, anyway) 
         */
        decpt_idx = get_exp(ext1) >= 0 ? (size_t)get_exp(ext1) : 0;
        for (new_exp = 0, idx = 0 ; idx < decpt_idx ; ++idx)
        {
            int dig;

            /* 
             *   get this digit if it's represented; if not, it's an
             *   implied trailing zero 
             */
            dig = (idx < get_prec(ext1) ? get_dig(ext1, idx) : 0);
            
            /* add this digit into the accumulator */
            new_exp *= 10;
            new_exp += dig;

            /* 
             *   Make sure we're still in range.  Note that, because our
             *   representation is 0.dddd*10^x, we need one more factor of
             *   ten than you'd think here, the adjust of the range from
             *   the expected -32768..32767 
             */
            if (new_exp > (get_neg(ext1) ? 32769L : 32766L))
                err_throw(VMERR_NUM_OVERFLOW);

            /* 
             *   zero out this digit, so that when we're done r1 has the
             *   fractional part only 
             */
            if (idx < get_prec(ext1))
                set_dig(ext1, idx, 0);
        }

        /* negate the exponent value if the source value is negative */
        if (get_neg(ext1))
            new_exp = -new_exp;

        /* normalize the fractional part, which remains in ext1 */
        normalize(ext1);

        /* 
         *   Multiply it by ln10, storing the result in r3.  This is the
         *   value we'll use with the Taylor series. 
         */
        compute_prod_into(ext3, ext1, ln10);

        /* 
         *   While our input value is greater than 0.5, divide it by two to
         *   make it smaller than 0.5.  This will speed up the series
         *   convergence.  When we're done, we'll correct for the divisions
         *   by squaring the result the same number of times that we halved
         *   'x', because e^2x = (e^x)^2.
         */
        copy_val(ext1, get_one(), FALSE);
        div_by_long(ext1, 2);
        for (twos = 0 ; compare_abs(ext3, ext1) > 0 ; ++twos)
            div_by_long(ext3, 2);

        /* 
         *   Start with 1+x in our accumulator (r1).  This unrolls the
         *   trivial first two steps of the loop, where n=0 (term=1) and n=1
         *   (term=x). 
         */
        copy_val(ext2, get_one(), FALSE);
        compute_sum_into(ext1, ext2, ext3);

        /* get term n=2 (x^2) into the current-power register (r2) */
        compute_prod_into(ext2, ext3, ext3);

        /* start with 2 in our factorial register (r4) */
        copy_val(ext4, get_one(), FALSE);
        mul_by_long(ext4, 2);

        /* start at term n=2, n! = 2 */
        n = 2;
        n_fact = 2;
        use_int_fact = TRUE;

        /* go until we reach the required precision */
        for (;;)
        {
            /* for efficiency, try integer division */
            if (use_int_fact)
            {
                /* 
                 *   we can still fit the factorial in an integer - divide
                 *   by the integer value of n!, since it's a lot faster 
                 */
                copy_val(ext5, ext2, FALSE);
                div_by_long(ext5, n_fact);

                /* calculate the next n! integer, if it'll fit in a long */
                if (n_fact > LONG_MAX/10/(n+1))
                {
                    /* 
                     *   it'll be too big next time - we'll have to start
                     *   using the full quotient calculation 
                     */
                    use_int_fact = FALSE;
                }
                else
                {
                    /* it'll still fit - calculate the next n! */
                    n_fact *= (n+1);
                }
            }
            else
            {
                /* compute x^n/n! (r2/r4) into r5 */
                compute_quotient_into(ext5, 0, ext2, ext4);
            }

            /* if we're below the required precision, we're done */
            if (is_zero(ext5)
                || get_exp(ext1) - get_exp(ext5) > (int)get_prec(ext1))
                break;

            /* compute the sum of the accumulator and this term into r6 */
            compute_sum_into(ext6, ext1, ext5);

            /* swap the result into the accumulator */
            tmp = ext1;
            ext1 = ext6;
            ext6 = tmp;

            /* on to the next term */
            ++n;

            /* compute the next factorial value */
            mul_by_long(ext4, n);

            /* compute the next power of x' into r5 */
            compute_prod_into(ext5, ext2, ext3);

            /* swap the result into our current-power register (r2) */
            tmp = ext2;
            ext2 = ext5;
            ext5 = tmp;
        }

        /* square the result as many times as we halved the argument */
        for ( ; twos != 0 ; --twos)
        {
            /* compute the square of r1 into r2 */
            compute_prod_into(ext2, ext1, ext1);

            /* swap the result back into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   set up our 10's exponent value - this is simply 1*10^new_exp,
         *   which we calculated earlier (which we represent as
         *   0.1*10^(new_exp+1)
         */
        copy_val(ext2, get_one(), FALSE);
        set_exp(ext2, (int)(new_exp + 1));

        /* multiply by the 10's exponent value */
        compute_prod_into(ext3, ext1, ext2);

        /* copy the result into the output register, rounding as needed */
        copy_val(dst, ext3, TRUE);
    }